

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi__uint16 * stbi__convert_format16(stbi__uint16 *data,int img_n,int req_comp,uint x,uint y)

{
  int iVar1;
  ushort uVar2;
  uint uVar3;
  stbi__uint16 *__ptr;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ushort *puVar7;
  stbi__uint16 *psVar8;
  char *pcVar9;
  ushort *puVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long *in_FS_OFFSET;
  undefined1 auVar15 [16];
  
  if (req_comp == img_n) {
    return data;
  }
  __ptr = (stbi__uint16 *)malloc((ulong)(req_comp * x * y * 2));
  if (__ptr == (stbi__uint16 *)0x0) {
    free(data);
    lVar6 = *in_FS_OFFSET;
    pcVar9 = "outofmem";
LAB_001bf790:
    *(char **)(lVar6 + -0x20) = pcVar9;
    __ptr = (stbi__uint16 *)0x0;
  }
  else {
    if (0 < (int)y) {
      uVar3 = req_comp + img_n * 8;
      if ((0x23 < uVar3) || ((0xe161a1c00U >> ((ulong)uVar3 & 0x3f) & 1) == 0)) {
        free(data);
        free(__ptr);
        lVar6 = *in_FS_OFFSET;
        pcVar9 = "unsupported";
        goto LAB_001bf790;
      }
      iVar1 = x - 1;
      uVar5 = 1;
      if (1 < (int)y) {
        uVar5 = (ulong)y;
      }
      uVar12 = 0;
      uVar13 = 0;
      uVar14 = 0;
      do {
        iVar4 = (int)uVar14 * x;
        puVar10 = data + (uint)(iVar4 * img_n);
        psVar8 = __ptr + (uint)(iVar4 * req_comp);
        switch(uVar3) {
        case 10:
          if (-1 < iVar1) {
            lVar6 = 0;
            uVar11 = x;
            do {
              __ptr[uVar13 + lVar6] = *(stbi__uint16 *)((long)data + lVar6 + uVar12 * 2);
              __ptr[uVar13 + lVar6 + 1] = 0xffff;
              uVar11 = uVar11 - 1;
              lVar6 = lVar6 + 2;
            } while (0 < (int)uVar11);
          }
          break;
        case 0xb:
          if (-1 < iVar1) {
            puVar7 = __ptr + uVar13 + 2;
            uVar11 = x;
            do {
              uVar2 = *puVar10;
              *puVar7 = uVar2;
              puVar7[-1] = uVar2;
              puVar7[-2] = uVar2;
              puVar10 = puVar10 + 1;
              uVar11 = uVar11 - 1;
              puVar7 = puVar7 + 3;
            } while (0 < (int)uVar11);
          }
          break;
        case 0xc:
          if (-1 < iVar1) {
            lVar6 = 0;
            uVar11 = x;
            do {
              auVar15._8_8_ = 0;
              auVar15._0_8_ = (ulong)*(ushort *)((long)data + lVar6 + uVar12 * 2) | 0xffff0000;
              auVar15 = pshuflw(auVar15,auVar15,0x40);
              *(long *)(__ptr + uVar13 + lVar6 * 2) = auVar15._0_8_;
              uVar11 = uVar11 - 1;
              lVar6 = lVar6 + 2;
            } while (0 < (int)uVar11);
          }
          break;
        default:
          uVar11 = x;
          if (-1 < iVar1) {
            do {
              *(undefined4 *)psVar8 = *(undefined4 *)puVar10;
              psVar8[2] = puVar10[2];
              puVar10 = puVar10 + 4;
              psVar8 = psVar8 + 3;
              uVar11 = uVar11 - 1;
            } while (0 < (int)uVar11);
          }
          break;
        case 0x11:
          if (-1 < iVar1) {
            lVar6 = 0;
            uVar11 = x;
            do {
              *(stbi__uint16 *)((long)__ptr + lVar6 + uVar13 * 2) = data[uVar12 + lVar6];
              uVar11 = uVar11 - 1;
              lVar6 = lVar6 + 2;
            } while (0 < (int)uVar11);
          }
          break;
        case 0x13:
          if (-1 < iVar1) {
            puVar7 = __ptr + uVar13 + 2;
            uVar11 = x;
            do {
              uVar2 = *puVar10;
              *puVar7 = uVar2;
              puVar7[-1] = uVar2;
              puVar7[-2] = uVar2;
              puVar10 = puVar10 + 2;
              uVar11 = uVar11 - 1;
              puVar7 = puVar7 + 3;
            } while (0 < (int)uVar11);
          }
          break;
        case 0x14:
          if (-1 < iVar1) {
            lVar6 = 0;
            uVar11 = x;
            do {
              auVar15 = ZEXT416(*(uint *)((long)data + lVar6 + uVar12 * 2));
              auVar15 = pshuflw(auVar15,auVar15,0x40);
              *(long *)(__ptr + uVar13 + lVar6) = auVar15._0_8_;
              uVar11 = uVar11 - 1;
              lVar6 = lVar6 + 4;
            } while (0 < (int)uVar11);
          }
          break;
        case 0x19:
          uVar11 = x;
          if (-1 < iVar1) {
            do {
              uVar2 = puVar10[2];
              *psVar8 = (stbi__uint16)
                        ((uint)uVar2 * 2 + ((uint)uVar2 + (uint)uVar2 * 8) * 3 +
                         (uint)puVar10[1] * 0x96 + (uint)*puVar10 * 0x4d >> 8);
              puVar10 = puVar10 + 3;
              psVar8 = psVar8 + 1;
              uVar11 = uVar11 - 1;
            } while (0 < (int)uVar11);
          }
          break;
        case 0x1a:
          uVar11 = x;
          if (-1 < iVar1) {
            do {
              uVar2 = puVar10[2];
              *psVar8 = (stbi__uint16)
                        ((uint)uVar2 * 2 + ((uint)uVar2 + (uint)uVar2 * 8) * 3 +
                         (uint)puVar10[1] * 0x96 + (uint)*puVar10 * 0x4d >> 8);
              psVar8[1] = 0xffff;
              puVar10 = puVar10 + 3;
              psVar8 = psVar8 + 2;
              uVar11 = uVar11 - 1;
            } while (0 < (int)uVar11);
          }
          break;
        case 0x1c:
          uVar11 = x;
          if (-1 < iVar1) {
            do {
              *(undefined4 *)psVar8 = *(undefined4 *)puVar10;
              psVar8[2] = puVar10[2];
              psVar8[3] = 0xffff;
              puVar10 = puVar10 + 3;
              psVar8 = psVar8 + 4;
              uVar11 = uVar11 - 1;
            } while (0 < (int)uVar11);
          }
          break;
        case 0x21:
          if (-1 < iVar1) {
            lVar6 = 0;
            uVar11 = x;
            do {
              uVar2 = data[uVar12 + lVar6 * 2 + 2];
              *(short *)((long)__ptr + lVar6 + uVar13 * 2) =
                   (short)((uint)uVar2 * 2 + ((uint)uVar2 + (uint)uVar2 * 8) * 3 +
                           (uint)data[uVar12 + lVar6 * 2 + 1] * 0x96 +
                           (uint)data[uVar12 + lVar6 * 2] * 0x4d >> 8);
              uVar11 = uVar11 - 1;
              lVar6 = lVar6 + 2;
            } while (0 < (int)uVar11);
          }
          break;
        case 0x22:
          if (-1 < iVar1) {
            lVar6 = 0;
            uVar11 = x;
            do {
              uVar2 = data[uVar12 + lVar6 + 2];
              *(short *)((long)__ptr + lVar6 + uVar13 * 2) =
                   (short)((uint)uVar2 * 2 + ((uint)uVar2 + (uint)uVar2 * 8) * 3 +
                           (uint)data[uVar12 + lVar6 + 1] * 0x96 + (uint)data[uVar12 + lVar6] * 0x4d
                          >> 8);
              *(stbi__uint16 *)((long)__ptr + lVar6 + uVar13 * 2 + 2) = data[uVar12 + lVar6 + 3];
              uVar11 = uVar11 - 1;
              lVar6 = lVar6 + 4;
            } while (0 < (int)uVar11);
          }
        }
        uVar14 = uVar14 + 1;
        uVar13 = (ulong)((int)uVar13 + req_comp * x);
        uVar12 = (ulong)((int)uVar12 + x * img_n);
      } while (uVar14 != uVar5);
    }
    free(data);
  }
  return __ptr;
}

Assistant:

static stbi__uint16 *stbi__convert_format16(stbi__uint16 *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   stbi__uint16 *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (stbi__uint16 *) stbi__malloc(req_comp * x * y * 2);
   if (good == NULL) {
      STBI_FREE(data);
      return (stbi__uint16 *) stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      stbi__uint16 *src  = data + j * x * img_n   ;
      stbi__uint16 *dest = good + j * x * req_comp;

      #define STBI__COMBO(a,b)  ((a)*8+(b))
      #define STBI__CASE(a,b)   case STBI__COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (STBI__COMBO(img_n, req_comp)) {
         STBI__CASE(1,2) { dest[0]=src[0]; dest[1]=0xffff;                                     } break;
         STBI__CASE(1,3) { dest[0]=dest[1]=dest[2]=src[0];                                     } break;
         STBI__CASE(1,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=0xffff;                     } break;
         STBI__CASE(2,1) { dest[0]=src[0];                                                     } break;
         STBI__CASE(2,3) { dest[0]=dest[1]=dest[2]=src[0];                                     } break;
         STBI__CASE(2,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=src[1];                     } break;
         STBI__CASE(3,4) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];dest[3]=0xffff;        } break;
         STBI__CASE(3,1) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]);                   } break;
         STBI__CASE(3,2) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]); dest[1] = 0xffff; } break;
         STBI__CASE(4,1) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]);                   } break;
         STBI__CASE(4,2) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]); dest[1] = src[3]; } break;
         STBI__CASE(4,3) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];                       } break;
         default: STBI_ASSERT(0); STBI_FREE(data); STBI_FREE(good); return (stbi__uint16*) stbi__errpuc("unsupported", "Unsupported format conversion");
      }
      #undef STBI__CASE
   }

   STBI_FREE(data);
   return good;
}